

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

bool __thiscall GGSock::FileServer::Impl::exists(Impl *this,FileInfo *info)

{
  pointer pFVar1;
  _Bit_type *p_Var2;
  pointer __s1;
  size_t __n;
  size_t sVar3;
  size_t __n_00;
  pointer __s1_00;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  size_type *psVar8;
  bool bVar9;
  
  pFVar1 = (this->files).
           super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (int)((long)(this->files).
                      super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 3) * -0x3b13b13b;
  if ((int)uVar6 < 1) {
    bVar9 = false;
  }
  else {
    p_Var2 = (this->fileUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    __s1 = (info->uri)._M_dataplus._M_p;
    __n = (info->uri)._M_string_length;
    sVar3 = info->filesize;
    __n_00 = (info->filename)._M_string_length;
    __s1_00 = (info->filename)._M_dataplus._M_p;
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    psVar8 = &(pFVar1->info).filename._M_string_length;
    bVar9 = true;
    uVar5 = 0;
    do {
      if (((((p_Var2[uVar5 >> 6 & 0x3ffffff] >> (uVar5 & 0x3f) & 1) != 0) && (__n == psVar8[-5])) &&
          ((__n == 0 || (iVar4 = bcmp(__s1,(void *)psVar8[-6],__n), iVar4 == 0)))) &&
         ((sVar3 == psVar8[-2] && (__n_00 == *psVar8)))) {
        if (__n_00 == 0) {
          return bVar9;
        }
        iVar4 = bcmp(__s1_00,(((TFilename *)(psVar8 + -1))->_M_dataplus)._M_p,__n_00);
        if (iVar4 == 0) {
          return bVar9;
        }
      }
      uVar5 = uVar5 + 1;
      bVar9 = uVar5 < uVar7;
      psVar8 = psVar8 + 0xd;
    } while (uVar7 != uVar5);
  }
  return bVar9;
}

Assistant:

bool exists(const FileInfo & info) const {
        for (int i = 0; i < (int) files.size(); ++i) {
            if (fileUsed[i] == false) {
                continue;
            }

            const auto & file = files[i];
            if (info.uri == file.info.uri &&
                info.filesize == file.info.filesize &&
                info.filename == file.info.filename) {
                return true;
            }
        }

        return false;
    }